

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_backup_sb_state(SB_FIRST_PASS_STATS *sb_fp_stats,AV1_COMP *cpi,ThreadData_conflict *td,
                        TileDataEnc *tile_data,int mi_row,int mi_col)

{
  int iVar1;
  long lVar2;
  MACROBLOCK *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  int alloc_mi_idx;
  BLOCK_SIZE sb_size;
  int num_planes;
  AV1_COMMON *cm;
  TileInfo *tile_info;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  long lVar3;
  MACROBLOCK *x_00;
  
  lVar2 = in_RDX + 0x1a0;
  lVar3 = in_RDX;
  x_00 = in_RCX;
  av1_num_planes((AV1_COMMON *)(in_RSI + 0x3bf80));
  *(long *)(lVar2 + 0x1fc0) =
       *(long *)(*(long *)(in_RSI + 0x42298) + (long)*(int *)&in_RCX->plane[0].qcoeff * 8) +
       (long)in_R9D;
  *(long *)(lVar2 + 0x1fc8) = lVar2 + 0x1fd0 + (long)(int)(in_R8D & 0x1f);
  av1_save_context(x_00,(RD_SEARCH_MACROBLOCK_CONTEXT *)CONCAT44(in_R8D,in_R9D),
                   (int)((ulong)lVar3 >> 0x20),(int)lVar3,(BLOCK_SIZE)((ulong)lVar2 >> 0x38),
                   (int)lVar2);
  memcpy((void *)(in_RDI + 0x150),(void *)(in_RDX + 0x256c0),0x598);
  *(undefined4 *)(in_RDI + 0x6e8) = *(undefined4 *)(lVar3 + 0x25618);
  memcpy((void *)(in_RDI + 0x6ec),*(void **)(in_RDX + 0x25c58),0xc0);
  if (*(int *)(in_RSI + 0x60a74) == 1) {
    memcpy((void *)(in_RDI + 0x7b0),(x_00->mode_costs).y_mode_costs[4][0xc] + 6,0x9a0);
  }
  memcpy((void *)(in_RDI + 0x1150),(void *)(lVar3 + 0x18c14),0x3a18);
  iVar1 = get_alloc_mi_idx((CommonModeInfoParams *)(in_RSI + 0x3c188),in_R8D,in_R9D);
  *(undefined4 *)(in_RDI + 0x4b68) =
       *(undefined4 *)(*(long *)(in_RSI + 0x3c1a0) + (long)iVar1 * 0xb0 + 4);
  return;
}

Assistant:

void av1_backup_sb_state(SB_FIRST_PASS_STATS *sb_fp_stats, const AV1_COMP *cpi,
                         ThreadData *td, const TileDataEnc *tile_data,
                         int mi_row, int mi_col) {
  MACROBLOCK *x = &td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  const TileInfo *tile_info = &tile_data->tile_info;

  const AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;

  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
  av1_save_context(x, &sb_fp_stats->x_ctx, mi_row, mi_col, sb_size, num_planes);

  sb_fp_stats->rd_count = td->rd_counts;
  sb_fp_stats->split_count = x->txfm_search_info.txb_split_count;

  sb_fp_stats->fc = *td->counts;

  // Don't copy in row_mt case, otherwise run into data race. No behavior change
  // in row_mt case.
  if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 1) {
    memcpy(sb_fp_stats->inter_mode_rd_models, tile_data->inter_mode_rd_models,
           sizeof(sb_fp_stats->inter_mode_rd_models));
  }

  memcpy(sb_fp_stats->thresh_freq_fact, x->thresh_freq_fact,
         sizeof(sb_fp_stats->thresh_freq_fact));

  const int alloc_mi_idx = get_alloc_mi_idx(&cm->mi_params, mi_row, mi_col);
  sb_fp_stats->current_qindex =
      cm->mi_params.mi_alloc[alloc_mi_idx].current_qindex;

#if CONFIG_INTERNAL_STATS
  memcpy(sb_fp_stats->mode_chosen_counts, cpi->mode_chosen_counts,
         sizeof(sb_fp_stats->mode_chosen_counts));
#endif  // CONFIG_INTERNAL_STATS
}